

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_lcl.c
# Opt level: O0

void beltPolyMul(word *c,word *a,word *b,void *stack)

{
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *prod;
  size_t n;
  void *in_stack_ffffffffffffffc8;
  
  ppMul(in_RSI,in_RDX,(size_t)(in_RCX + 4),(word *)0x2,(size_t)in_RCX,in_stack_ffffffffffffffc8);
  ppRedBelt(in_RCX);
  wwCopy(in_RDI,in_RCX,2);
  return;
}

Assistant:

void beltPolyMul(word c[], const word a[], const word b[], void* stack)
{
	const size_t n = W_OF_B(128);
	word* prod = (word*)stack;
	stack = prod + 2 * n;
	// умножить
	ppMul(prod, a, n, b, n, stack);
	// привести по модулю
	ppRedBelt(prod);
	wwCopy(c, prod, n);
}